

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_func_def(SyntaxAnalyze *this)

{
  SymbolTable *this_00;
  irGenerator *this_01;
  string name_00;
  pointer ppVar1;
  pointer psVar2;
  bool bVar3;
  SymbolKind SVar4;
  FunctionSymbol *this_02;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  SyntaxAnalyze *this_03;
  pointer ppVar6;
  undefined4 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbc [12];
  SyntaxAnalyze *pSVar7;
  uint layerNum;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 uVar9;
  SharedSyPtr func;
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  genValues;
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  params;
  pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  var_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramsName;
  shared_ptr<front::symbol::Symbol> var;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_168;
  string name;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0 [32];
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  params.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paramsName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  paramsName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paramsName.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  genValues.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  genValues.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  genValues.
  super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar3 = try_word(this,1,INTTK);
  if (!bVar3) {
    match_one_word(this,VOIDTK);
  }
  else {
    match_one_word(this,INTTK);
  }
  SVar4 = (SymbolKind)!bVar3;
  match_one_word(this,IDENFR);
  this_03 = this;
  word::Word::get_self_abi_cxx11_
            ((string *)&var_1,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)&var_1);
  std::__cxx11::string::~string((string *)&var_1);
  layerNum = this->layer_num;
  this_02 = (FunctionSymbol *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_e0,(string *)&name);
  symbol::FunctionSymbol::FunctionSymbol(this_02,&local_e0,SVar4,layerNum);
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
  reset<front::symbol::FunctionSymbol>
            (&func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_02);
  std::__cxx11::string::~string((string *)&local_e0);
  this_00 = &this_03->symbolTable;
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,&func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)
  ;
  symbolTable::SymbolTable::push_symbol(this_00,(SharedSyPtr *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  std::__cxx11::string::string((string *)&local_120,(string *)&name);
  this_01 = &this_03->irGenerator;
  irGenerator::irGenerator::getFunctionName(&local_100,this_01,&local_120);
  irGenerator::irGenerator::ir_declare_function(this_01,&local_100,SVar4);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  match_one_word(this_03,LPARENT);
  bVar3 = try_word(this_03,1,RPARENT);
  if (!bVar3) {
    gm_func_param(this_03,&params,layerNum,&genValues);
    pSVar7 = this_03;
    while( true ) {
      bVar3 = try_word(this_03,1,COMMA);
      this_03 = pSVar7;
      if (!bVar3) break;
      pSVar7 = this_03;
      match_one_word(this_03,COMMA);
      gm_func_param(this_03,&params,layerNum,&genValues);
    }
  }
  psVar2 = params.
           super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var5 = &(params.
                  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 != &psVar2->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&var.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    std::static_pointer_cast<front::symbol::FunctionSymbol,front::symbol::Symbol>(&var_1.first);
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
                 *)&var_1.first.
                    super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                    _name,
                (value_type *)
                &var.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&var_1.first.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::string
              (local_a0,(string *)
                        &(var.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_name);
    name_00._4_12_ = in_stack_fffffffffffffdbc;
    name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffdb8;
    name_00.field_2._M_allocated_capacity = (size_type)this_03;
    name_00.field_2._8_4_ = layerNum;
    name_00.field_2._12_4_ = in_stack_fffffffffffffdd4;
    irGenerator::irGenerator::getVarName((string *)&var_1,this_01,name_00,(uint32_t)local_a0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paramsName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_1);
    std::__cxx11::string::~string((string *)&var_1);
    std::__cxx11::string::~string(local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&var.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  irGenerator::irGenerator::ir_finish_param_declare(this_01,&paramsName);
  ppVar1 = genValues.
           super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar6 = genValues.
           super__Vector_base<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (ppVar6 != ppVar1) {
    uVar8 = SUB84(ppVar6,0);
    uVar9 = (undefined4)((ulong)ppVar6 >> 0x20);
    std::
    pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&var_1,ppVar6);
    std::__cxx11::string::string
              ((string *)&local_c0,
               (string *)
               &(var_1.first.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
    SVar4 = (**(var_1.first.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_Symbol)();
    local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    irGenerator::irGenerator::ir_declare_value
              (this_01,&local_c0,SVar4,
               (var_1.first.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->id,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,Var,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_138);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string
              ((string *)&var,
               (string *)
               &(var_1.first.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_name);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<int,std::__cxx11::string> *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
    std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,int,std::__cxx11::string> *)&local_80,&var_1.second);
    irGenerator::irGenerator::ir_assign(this_01,(LeftVal *)&local_58,(RightVal *)&local_80);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_80);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
    std::__cxx11::string::~string((string *)&var);
    std::
    pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&var_1);
    ppVar6 = (pointer)(CONCAT44(uVar9,uVar8) + 0x30);
  }
  match_one_word(this_03,RPARENT);
  gm_block(this_03);
  irGenerator::irGenerator::ir_leave_function(this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&func.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::
  vector<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<front::symbol::Symbol>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&genValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&paramsName);
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::~vector(&params);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}